

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  double dVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  int iVar6;
  float *pfVar7;
  byte bVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  double dVar15;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  uVar9 = (flags & 0x100000U) >> 0x14;
  IVar5 = GImGui->ActiveIdSource;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar5 = pIVar2->ActiveIdSource;
      goto LAB_00165283;
    }
    pfVar7 = ImVec2::operator[](&(pIVar2->IO).MouseDelta,(ulong)uVar9);
    fVar14 = *pfVar7;
    if ((pIVar2->IO).KeyAlt != false) {
      fVar14 = fVar14 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar14 = fVar14 * 10.0;
    }
  }
  else {
LAB_00165283:
    fVar14 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      iVar6 = 0;
      if (uVar4 == 8) {
        iVar6 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar7 = ImVec2::operator[](&local_38,(ulong)uVar9);
      fVar14 = *pfVar7;
      fVar11 = GetMinimumStepAtDecimalPrecision(iVar6);
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  bVar8 = uVar4 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar14 = fVar14 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar14 = -fVar14;
  }
  if (((bVar8 != 0) && (dVar15 = v_max - v_min, dVar15 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar15)) {
    fVar14 = fVar14 / (float)dVar15;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar14)) goto LAB_001653bf;
    bVar3 = fVar14 < 0.0 && *v <= v_min;
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar14;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    dVar15 = *v;
    if (bVar8 == 0) {
      dVar15 = dVar15 + (double)pIVar2->DragCurrentAccum;
      fVar10 = 0.0;
      fVar11 = 0.0;
    }
    else {
      iVar6 = ImParseFormatPrecision(format,3);
      fVar10 = powf(0.1,(float)iVar6);
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar15,v_min,v_max,true,fVar10,0.0);
      dVar15 = ScaleValueFromRatioT<double,double,double>
                         (data_type,pIVar2->DragCurrentAccum + fVar11,v_min,v_max,true,fVar10,0.0);
    }
    if ((flags & 0x40U) == 0) {
      dVar15 = RoundScalarWithFormatT<double,double>(format,data_type,dVar15);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar8 == 0) {
      dVar1 = *v;
      uVar12 = SUB84(dVar1,0);
      uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(dVar15 - dVar1);
    }
    else {
      fVar10 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar15,v_min,v_max,true,fVar10,0.0);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar10 - fVar11);
      uVar12 = SUB84(*v,0);
      uVar13 = (undefined4)((ulong)*v >> 0x20);
    }
    dVar15 = (double)(~-(ulong)(dVar15 == 0.0) & (ulong)dVar15);
    if (v_min < v_max) {
      if (((double)CONCAT44(uVar13,uVar12) != dVar15) ||
         (NAN((double)CONCAT44(uVar13,uVar12)) || NAN(dVar15))) {
        if ((dVar15 < v_min) ||
           (((uVar4 != 8 &&
             ((double)CONCAT44(uVar13,uVar12) <= dVar15 && dVar15 != (double)CONCAT44(uVar13,uVar12)
             )) && (fVar14 < 0.0)))) {
          dVar15 = v_min;
        }
        if ((v_max < dVar15) ||
           (((uVar4 != 8 &&
             (dVar15 <= (double)CONCAT44(uVar13,uVar12) && (double)CONCAT44(uVar13,uVar12) != dVar15
             )) && (0.0 < fVar14)))) {
          dVar15 = v_max;
        }
      }
    }
    if (((double)CONCAT44(uVar13,uVar12) == dVar15) &&
       (!NAN((double)CONCAT44(uVar13,uVar12)) && !NAN(dVar15))) {
      return false;
    }
    *v = dVar15;
    return true;
  }
LAB_001653bf:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f * 1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}